

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void invokeProfileCallback(sqlite3 *db,Vdbe *p)

{
  long lVar1;
  sqlite3_int64 *in_RSI;
  sqlite3_vfs *in_RDI;
  long in_FS_OFFSET;
  sqlite3_int64 iElapse;
  sqlite3_int64 iNow;
  undefined1 *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  sqlite3OsCurrentTimeInt64(in_RDI,in_RSI);
  if (in_RDI[1].xDlSym != (_func__func_void_ptr_sqlite3_vfs_ptr_void_ptr_char_ptr *)0x0) {
    (*in_RDI[1].xDlSym)((sqlite3_vfs *)in_RDI[1].xDlClose,(void *)in_RSI[0x1f],
                        (char *)(((long)local_10 - in_RSI[0x17]) * 1000000));
  }
  if (((ulong)in_RDI->xRandomness & 0x2000000000000) != 0) {
    (*in_RDI[1].xDlOpen)((sqlite3_vfs *)0x2,(char *)in_RDI[1].xDlError);
  }
  in_RSI[0x17] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static SQLITE_NOINLINE void invokeProfileCallback(sqlite3 *db, Vdbe *p){
  sqlite3_int64 iNow;
  sqlite3_int64 iElapse;
  assert( p->startTime>0 );
  assert( db->init.busy==0 );
  assert( p->zSql!=0 );
  sqlite3OsCurrentTimeInt64(db->pVfs, &iNow);
  iElapse = (iNow - p->startTime)*1000000;
#ifndef SQLITE_OMIT_DEPRECATED
  if( db->xProfile ){
    db->xProfile(db->pProfileArg, p->zSql, iElapse);
  }
#endif
  if( db->mTrace & SQLITE_TRACE_PROFILE ){
    db->trace.xV2(SQLITE_TRACE_PROFILE, db->pTraceArg, p, (void*)&iElapse);
  }
  p->startTime = 0;
}